

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  cmTargets *this_00;
  cmMakefile *pcVar1;
  cmake *pcVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  pointer ppcVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  pointer ppcVar9;
  PolicyID id;
  uint uVar10;
  ulong uVar11;
  __node_base *p_Var12;
  pointer this_01;
  undefined1 local_278 [32];
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_258;
  PositionType local_250;
  AutogensType autogens;
  string local_230;
  Snapshot local_210;
  Snapshot local_1f8;
  cmTargets globalTargets;
  ostringstream w;
  
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x20])();
  if ((char)iVar4 != '\0') {
    FinalizeTargetCompileInfo(this);
    autogens.
    super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    autogens.
    super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    autogens.
    super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CreateQtAutoGeneratorsTargets(this,&autogens);
    globalTargets._M_h._M_buckets = &globalTargets._M_h._M_single_bucket;
    globalTargets._M_h._M_bucket_count = 1;
    globalTargets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    globalTargets._M_h._M_element_count = 0;
    globalTargets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    globalTargets._M_h._M_rehash_policy._M_next_resize = 0;
    globalTargets._M_h._M_single_bucket = (__node_base_ptr)0x0;
    CreateDefaultGlobalTargets(this,&globalTargets);
    uVar10 = 0;
    while( true ) {
      uVar11 = (ulong)uVar10;
      ppcVar6 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar9 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppcVar9 - (long)ppcVar6 >> 3) <= uVar11) break;
      cmLocalGenerator::ComputeObjectMaxPath(ppcVar6[uVar11]);
      pcVar1 = (this->LocalGenerators).
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11]->Makefile;
      this_00 = &pcVar1->Targets;
      p_Var12 = &globalTargets._M_h._M_before_begin;
      while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,(key_type *)(p_Var12 + 1));
        cmTarget::operator=(pmVar5,(cmTarget *)(p_Var12 + 5));
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,(key_type *)(p_Var12 + 1));
        cmTarget::SetMakefile(pmVar5,pcVar1);
      }
      uVar10 = uVar10 + 1;
    }
    for (uVar10 = 0; (ulong)uVar10 < (ulong)((long)ppcVar9 - (long)ppcVar6 >> 3);
        uVar10 = uVar10 + 1) {
      (*ppcVar6[uVar10]->_vptr_cmLocalGenerator[4])();
      ppcVar6 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar9 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    CreateGeneratorTargets(this);
    for (this_01 = autogens.
                   super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_01 !=
        autogens.
        super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
      cmQtAutoGenerators::SetupAutoGenerateTarget(&this_01->first,this_01->second);
    }
    uVar10 = 0;
    while( true ) {
      ppcVar6 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->LocalGenerators).
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar6 >> 3) <=
          (ulong)uVar10) break;
      cmLocalGenerator::TraceDependencies(ppcVar6[uVar10]);
      uVar10 = uVar10 + 1;
    }
    (*this->_vptr_cmGlobalGenerator[0x23])(this);
    uVar10 = 0;
    while( true ) {
      ppcVar6 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->LocalGenerators).
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar6 >> 3) <=
          (ulong)uVar10) break;
      cmLocalGenerator::GenerateTargetManifest(ppcVar6[uVar10]);
      uVar10 = uVar10 + 1;
    }
    ProcessEvaluationFiles(this);
    iVar4 = (*this->_vptr_cmGlobalGenerator[0x1f])(this);
    if ((char)iVar4 != '\0') {
      FillLocalGeneratorToTargetMap(this);
      uVar10 = 0;
      while( true ) {
        ppcVar6 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppcVar9 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)ppcVar9 - (long)ppcVar6 >> 3) <= (ulong)uVar10) break;
        (*ppcVar6[uVar10]->_vptr_cmLocalGenerator[3])();
        uVar10 = uVar10 + 1;
      }
      for (uVar10 = 0; uVar11 = (ulong)uVar10, uVar11 < (ulong)((long)ppcVar9 - (long)ppcVar6 >> 3);
          uVar10 = uVar10 + 1) {
        this->CurrentMakefile = ppcVar6[uVar11]->Makefile;
        (*ppcVar6[uVar11]->_vptr_cmLocalGenerator[2])();
        pcVar1 = (this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar11]->Makefile;
        std::__cxx11::string::string((string *)&w,"CMAKE_SKIP_INSTALL_RULES",(allocator *)local_278)
        ;
        bVar3 = cmMakefile::IsOn(pcVar1,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        if (!bVar3) {
          cmLocalGenerator::GenerateInstallRules
                    ((this->LocalGenerators).
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar11]);
        }
        cmLocalGenerator::GenerateTestFiles
                  ((this->LocalGenerators).
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11]);
        cmake::UpdateProgress
                  (this->CMakeInstance,"Generating",
                   ((float)uVar11 + 1.0) /
                   (float)(ulong)((long)(this->LocalGenerators).
                                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->LocalGenerators).
                                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
        ppcVar6 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppcVar9 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      this->CurrentMakefile = (cmMakefile *)0x0;
      GenerateCPackPropertiesFile(this);
      for (p_Var7 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        bVar3 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var7 + 2));
        if ((!bVar3) && (bVar3 = cmSystemTools::GetErrorOccuredFlag(), !bVar3)) {
          pcVar2 = this->CMakeInstance;
          std::__cxx11::string::string
                    ((string *)local_278,"Could not write export file.",(allocator *)&local_230);
          cmState::Snapshot::Snapshot(&local_1f8,(cmState *)0x0,(PositionType)ZEXT816(0));
          _w = (pointer)0x0;
          cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_278,(cmListFileBacktrace *)&w);
          std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                    ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)&w);
          std::__cxx11::string::~string((string *)local_278);
          goto LAB_002720c4;
        }
      }
      CheckRuleHashes(this);
      WriteSummary(this);
      if (this->ExtraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*this->ExtraGenerator->_vptr_cmExternalMakefileProjectGenerator[6])();
      }
      if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_278,(cmPolicies *)0x2a,id);
        poVar8 = std::operator<<((ostream *)&w,(string *)local_278);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)local_278);
        std::operator<<((ostream *)&w,"MACOSX_RPATH is not specified for the following targets:\n");
        for (p_Var7 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            (_Rb_tree_header *)p_Var7 !=
            &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          poVar8 = std::operator<<((ostream *)&w," ");
          poVar8 = std::operator<<(poVar8,(string *)(p_Var7 + 1));
          std::operator<<(poVar8,"\n");
        }
        pcVar2 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmState::Snapshot::Snapshot(&local_210,(cmState *)0x0,(PositionType)ZEXT816(0));
        local_250 = local_210.Position.Position;
        local_278._24_8_ = local_210.State;
        pcStack_258 = local_210.Position.Tree;
        local_278._0_8_ = (pointer)0x0;
        local_278._8_8_ = (pointer)0x0;
        local_278._16_8_ = 0;
        cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_230,(cmListFileBacktrace *)local_278);
        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_278);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
      }
      cmake::UpdateProgress(this->CMakeInstance,"Generating done",-1.0);
    }
LAB_002720c4:
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&globalTargets._M_h);
    std::
    vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ::~vector(&autogens);
  }
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Check whether this generator is allowed to run.
  if(!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS())
    {
    return;
    }

  this->FinalizeTargetCompileInfo();

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Iterate through all targets and set up automoc for those which have
  // the AUTOMOC, AUTOUIC or AUTORCC property set
  AutogensType autogens;
  this->CreateQtAutoGeneratorsTargets(autogens);
#endif

  // For each existing cmLocalGenerator
  unsigned int i;

  // Put a copy of each global target in every directory.
  cmTargets globalTargets;
  this->CreateDefaultGlobalTargets(&globalTargets);
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeObjectMaxPath();
    cmMakefile* mf = this->LocalGenerators[i]->GetMakefile();
    cmTargets* targets = &(mf->GetTargets());
    cmTargets::iterator tit;
    for ( tit = globalTargets.begin(); tit != globalTargets.end(); ++ tit )
      {
      (*targets)[tit->first] = tit->second;
      (*targets)[tit->first].SetMakefile(mf);
      }
    }

  // Add generator specific helper commands
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->AddHelperCommands();
    }

  // Create per-target generator information.
  this->CreateGeneratorTargets();

#ifdef CMAKE_BUILD_WITH_CMAKE
  for (AutogensType::iterator it = autogens.begin(); it != autogens.end();
       ++it)
    {
    it->first.SetupAutoGenerateTarget(it->second);
    }
#endif

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->TraceDependencies();
    }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->GenerateTargetManifest();
    }

  this->ProcessEvaluationFiles();

  // Compute the inter-target dependencies.
  if(!this->ComputeTargetDepends())
    {
    return;
    }

  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->FillLocalGeneratorToTargetMap();

  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeHomeRelativeOutputPath();
    }

  // Generate project files
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if(!this->LocalGenerators[i]->GetMakefile()->IsOn(
      "CMAKE_SKIP_INSTALL_RULES"))
      {
      this->LocalGenerators[i]->GenerateInstallRules();
      }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress("Generating",
      (static_cast<float>(i)+1.0f)/
       static_cast<float>(this->LocalGenerators.size()));
    }
  this->SetCurrentMakefile(0);

  if(!this->GenerateCPackPropertiesFile())
    {
    this->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, "Could not write CPack properties file.");
    }

  for (std::map<std::string, cmExportBuildFileGenerator*>::iterator
      it = this->BuildExportSets.begin(); it != this->BuildExportSets.end();
      ++it)
    {
    if (!it->second->GenerateImportFile()
        && !cmSystemTools::GetErrorOccuredFlag())
      {
      this->GetCMakeInstance()
          ->IssueMessage(cmake::FATAL_ERROR, "Could not write export file.");
      return;
      }
    }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator != 0)
    {
    this->ExtraGenerator->Generate();
    }

  if(!this->CMP0042WarnTargets.empty())
    {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for(std::set<std::string>::iterator
      iter = this->CMP0042WarnTargets.begin();
      iter != this->CMP0042WarnTargets.end();
      ++iter)
      {
      w << " " << *iter << "\n";
      }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}